

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O2

bool embree::avx::FlatLinearCurveMiMBIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Scene *pSVar9;
  Geometry *pGVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  ulong uVar15;
  float fVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  float fVar21;
  float fVar26;
  float fVar27;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar28;
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  float fVar29;
  float fVar34;
  float fVar35;
  undefined1 auVar30 [16];
  float fVar36;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  float fVar37;
  float fVar41;
  float fVar42;
  undefined1 auVar38 [16];
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar57;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<4> hit;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  undefined1 local_2f0 [8];
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [8];
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [16];
  Primitive *local_270;
  RayQueryContext *local_268;
  RTCFilterFunctionNArguments local_260;
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  float local_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar56 [64];
  
  pSVar9 = context->scene;
  uVar18 = line->sharedGeomID;
  uVar5 = (line->v0).field_0.i[0];
  pGVar10 = (pSVar9->geometries).items[uVar18].ptr;
  fVar29 = (pGVar10->time_range).lower;
  fVar29 = pGVar10->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar29) / ((pGVar10->time_range).upper - fVar29));
  auVar30 = vroundss_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29),9);
  auVar30 = vminss_avx(auVar30,ZEXT416((uint)(pGVar10->fnumTimeSegments + -1.0)));
  auVar48 = vmaxss_avx(ZEXT816(0) << 0x20,auVar30);
  lVar11 = *(long *)&pGVar10[3].time_range.upper;
  lVar20 = (long)(int)auVar48._0_4_ * 0x38;
  lVar12 = *(long *)(lVar11 + lVar20);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar20);
  auVar30 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)uVar5);
  uVar6 = (line->v0).field_0.i[1];
  auVar3 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)uVar6);
  uVar7 = (line->v0).field_0.i[2];
  auVar22 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)uVar7);
  uVar8 = (line->v0).field_0.i[3];
  auVar4 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)uVar8);
  auVar23 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)(uVar5 + 1));
  auVar24 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)(uVar6 + 1));
  auVar31 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)(uVar7 + 1));
  auVar32 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)(uVar8 + 1));
  lVar12 = *(long *)(lVar11 + 0x38 + lVar20);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar20);
  auVar38 = *(undefined1 (*) [16])(lVar12 + (ulong)uVar5 * lVar11);
  auVar39 = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * lVar11);
  auVar44 = *(undefined1 (*) [16])(lVar12 + (ulong)uVar7 * lVar11);
  auVar45 = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * lVar11);
  auVar46 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar5 + 1) * lVar11);
  auVar47 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * lVar11);
  fVar29 = fVar29 - auVar48._0_4_;
  auVar48 = vunpcklps_avx(auVar30,auVar22);
  auVar30 = vunpckhps_avx(auVar30,auVar22);
  auVar22 = vunpcklps_avx(auVar3,auVar4);
  auVar3 = vunpckhps_avx(auVar3,auVar4);
  auVar49 = vunpcklps_avx(auVar48,auVar22);
  auVar22 = vunpckhps_avx(auVar48,auVar22);
  auVar48 = vunpcklps_avx(auVar30,auVar3);
  auVar4 = vunpckhps_avx(auVar30,auVar3);
  auVar50 = vunpcklps_avx(auVar23,auVar31);
  auVar30 = vunpckhps_avx(auVar23,auVar31);
  auVar23 = vunpcklps_avx(auVar24,auVar32);
  auVar3 = vunpckhps_avx(auVar24,auVar32);
  auVar51 = vunpcklps_avx(auVar50,auVar23);
  auVar23 = vunpckhps_avx(auVar50,auVar23);
  auVar50 = vunpcklps_avx(auVar30,auVar3);
  auVar24 = vunpckhps_avx(auVar30,auVar3);
  auVar31 = vunpcklps_avx(auVar38,auVar44);
  auVar30 = vunpckhps_avx(auVar38,auVar44);
  auVar32 = vunpcklps_avx(auVar39,auVar45);
  auVar3 = vunpckhps_avx(auVar39,auVar45);
  auVar44 = vunpcklps_avx(auVar31,auVar32);
  auVar31 = vunpckhps_avx(auVar31,auVar32);
  auVar45 = vunpcklps_avx(auVar30,auVar3);
  auVar32 = vunpckhps_avx(auVar30,auVar3);
  auVar39 = vunpcklps_avx(auVar46,auVar47);
  auVar38 = vunpckhps_avx(auVar46,auVar47);
  auVar30 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * lVar11);
  auVar3 = *(undefined1 (*) [16])(lVar12 + lVar11 * (ulong)(uVar8 + 1));
  auVar46 = vunpcklps_avx(auVar30,auVar3);
  auVar30 = vunpckhps_avx(auVar30,auVar3);
  auVar47 = vunpcklps_avx(auVar39,auVar46);
  auVar39 = vunpckhps_avx(auVar39,auVar46);
  auVar46 = vunpcklps_avx(auVar38,auVar30);
  auVar38 = vunpckhps_avx(auVar38,auVar30);
  auVar30 = vshufps_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29),0);
  auVar3 = vshufps_avx(ZEXT416((uint)(1.0 - fVar29)),ZEXT416((uint)(1.0 - fVar29)),0);
  fVar29 = auVar30._0_4_;
  fVar21 = auVar30._4_4_;
  fVar26 = auVar30._8_4_;
  fVar27 = auVar30._12_4_;
  local_2a0._0_4_ = auVar49._0_4_;
  local_2a0._4_4_ = auVar49._4_4_;
  fStack_298 = auVar49._8_4_;
  fStack_294 = auVar49._12_4_;
  local_200 = auVar3._0_4_;
  fStack_1fc = auVar3._4_4_;
  fStack_1f8 = auVar3._8_4_;
  fStack_1f4 = auVar3._12_4_;
  local_280._0_4_ = fVar29 * auVar44._0_4_ + local_200 * (float)local_2a0._0_4_;
  local_280._4_4_ = fVar21 * auVar44._4_4_ + fStack_1fc * (float)local_2a0._4_4_;
  local_280._8_4_ = fVar26 * auVar44._8_4_ + fStack_1f8 * fStack_298;
  local_280._12_4_ = fVar27 * auVar44._12_4_ + fStack_1f4 * fStack_294;
  local_220._0_4_ = local_200 * auVar22._0_4_ + fVar29 * auVar31._0_4_;
  local_220._4_4_ = fStack_1fc * auVar22._4_4_ + fVar21 * auVar31._4_4_;
  local_220._8_4_ = fStack_1f8 * auVar22._8_4_ + fVar26 * auVar31._8_4_;
  local_220._12_4_ = fStack_1f4 * auVar22._12_4_ + fVar27 * auVar31._12_4_;
  local_2f0._0_4_ = auVar48._0_4_;
  local_2f0._4_4_ = auVar48._4_4_;
  fStack_2e8 = auVar48._8_4_;
  fStack_2e4 = auVar48._12_4_;
  local_230._0_4_ = local_200 * (float)local_2f0._0_4_ + fVar29 * auVar45._0_4_;
  local_230._4_4_ = fStack_1fc * (float)local_2f0._4_4_ + fVar21 * auVar45._4_4_;
  local_230._8_4_ = fStack_1f8 * fStack_2e8 + fVar26 * auVar45._8_4_;
  local_230._12_4_ = fStack_1f4 * fStack_2e4 + fVar27 * auVar45._12_4_;
  local_2a0._0_4_ = auVar4._0_4_ * local_200 + fVar29 * auVar32._0_4_;
  local_2a0._4_4_ = auVar4._4_4_ * fStack_1fc + fVar21 * auVar32._4_4_;
  fStack_298 = auVar4._8_4_ * fStack_1f8 + fVar26 * auVar32._8_4_;
  fStack_294 = auVar4._12_4_ * fStack_1f4 + fVar27 * auVar32._12_4_;
  auVar30._0_4_ = fVar29 * auVar46._0_4_;
  auVar30._4_4_ = fVar21 * auVar46._4_4_;
  auVar30._8_4_ = fVar26 * auVar46._8_4_;
  auVar30._12_4_ = fVar27 * auVar46._12_4_;
  local_210 = auVar51._0_4_ * local_200 + fVar29 * auVar47._0_4_;
  fStack_20c = auVar51._4_4_ * fStack_1fc + fVar21 * auVar47._4_4_;
  fStack_208 = auVar51._8_4_ * fStack_1f8 + fVar26 * auVar47._8_4_;
  fStack_204 = auVar51._12_4_ * fStack_1f4 + fVar27 * auVar47._12_4_;
  local_2f0._4_4_ = fStack_1fc * auVar23._4_4_ + fVar21 * auVar39._4_4_;
  local_2f0._0_4_ = local_200 * auVar23._0_4_ + fVar29 * auVar39._0_4_;
  fStack_2e8 = fStack_1f8 * auVar23._8_4_ + fVar26 * auVar39._8_4_;
  fStack_2e4 = fStack_1f4 * auVar23._12_4_ + fVar27 * auVar39._12_4_;
  local_300._0_4_ = auVar50._0_4_;
  local_300._4_4_ = auVar50._4_4_;
  fStack_2f8 = auVar50._8_4_;
  fStack_2f4 = auVar50._12_4_;
  local_300._4_4_ = fStack_1fc * (float)local_300._4_4_ + auVar30._4_4_;
  local_300._0_4_ = local_200 * (float)local_300._0_4_ + auVar30._0_4_;
  fStack_2f8 = fStack_1f8 * fStack_2f8 + auVar30._8_4_;
  fStack_2f4 = fStack_1f4 * fStack_2f4 + auVar30._12_4_;
  local_290._0_4_ = auVar24._0_4_;
  local_290._4_4_ = auVar24._4_4_;
  fStack_288 = auVar24._8_4_;
  fStack_284 = auVar24._12_4_;
  local_200 = local_200 * (float)local_290._0_4_;
  fStack_1fc = fStack_1fc * (float)local_290._4_4_;
  fStack_1f8 = fStack_1f8 * fStack_288;
  fStack_1f4 = fStack_1f4 * fStack_284;
  auVar30 = vpcmpeqd_avx(auVar30,auVar30);
  _local_290 = vpcmpeqd_avx(auVar30,(undefined1  [16])(line->primIDs).field_0);
  local_200 = fVar29 * auVar38._0_4_ + local_200;
  fStack_1fc = fVar21 * auVar38._4_4_ + fStack_1fc;
  fStack_1f8 = fVar26 * auVar38._8_4_ + fStack_1f8;
  fStack_1f4 = fVar27 * auVar38._12_4_ + fStack_1f4;
  local_1f0 = vshufps_avx(ZEXT416(uVar18),ZEXT416(uVar18),0);
  fVar29 = pre->ray_space[k].vy.field_0.m128[0];
  fVar21 = pre->ray_space[k].vz.field_0.m128[0];
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar68._4_4_ = uVar1;
  auVar68._0_4_ = uVar1;
  auVar68._8_4_ = uVar1;
  auVar68._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  auVar30 = vsubps_avx(local_220,auVar68);
  auVar3 = vsubps_avx(local_230,auVar50);
  fVar41 = auVar3._0_4_;
  fVar43 = auVar3._4_4_;
  fVar65 = auVar3._8_4_;
  fVar67 = auVar3._12_4_;
  fVar42 = auVar30._0_4_;
  fVar64 = auVar30._4_4_;
  fVar66 = auVar30._8_4_;
  fVar16 = auVar30._12_4_;
  fVar26 = pre->ray_space[k].vy.field_0.m128[1];
  fVar27 = pre->ray_space[k].vz.field_0.m128[1];
  fVar28 = pre->ray_space[k].vz.field_0.m128[2];
  fVar34 = pre->ray_space[k].vy.field_0.m128[2];
  fVar35 = pre->ray_space[k].vx.field_0.m128[0];
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar30 = vsubps_avx(local_280,auVar22);
  fVar57 = auVar30._0_4_;
  fVar60 = auVar30._4_4_;
  fVar61 = auVar30._8_4_;
  fVar62 = auVar30._12_4_;
  auVar54._0_4_ = fVar29 * fVar42 + fVar21 * fVar41 + fVar57 * fVar35;
  auVar54._4_4_ = fVar29 * fVar64 + fVar21 * fVar43 + fVar60 * fVar35;
  auVar54._8_4_ = fVar29 * fVar66 + fVar21 * fVar65 + fVar61 * fVar35;
  auVar54._12_4_ = fVar29 * fVar16 + fVar21 * fVar67 + fVar62 * fVar35;
  fVar36 = pre->ray_space[k].vx.field_0.m128[1];
  auVar63._0_4_ = fVar57 * fVar36 + fVar26 * fVar42 + fVar27 * fVar41;
  auVar63._4_4_ = fVar60 * fVar36 + fVar26 * fVar64 + fVar27 * fVar43;
  auVar63._8_4_ = fVar61 * fVar36 + fVar26 * fVar66 + fVar27 * fVar65;
  auVar63._12_4_ = fVar62 * fVar36 + fVar26 * fVar16 + fVar27 * fVar67;
  fVar37 = pre->ray_space[k].vx.field_0.m128[2];
  auVar58._0_4_ = fVar37 * fVar57 + fVar34 * fVar42 + fVar28 * fVar41;
  auVar58._4_4_ = fVar37 * fVar60 + fVar34 * fVar64 + fVar28 * fVar43;
  auVar58._8_4_ = fVar37 * fVar61 + fVar34 * fVar66 + fVar28 * fVar65;
  auVar58._12_4_ = fVar37 * fVar62 + fVar34 * fVar16 + fVar28 * fVar67;
  auVar30 = vsubps_avx(_local_300,auVar50);
  fVar41 = auVar30._0_4_;
  fVar64 = auVar30._4_4_;
  fVar67 = auVar30._8_4_;
  fVar60 = auVar30._12_4_;
  auVar30 = vsubps_avx(_local_2f0,auVar68);
  auVar4._4_4_ = fStack_20c;
  auVar4._0_4_ = local_210;
  auVar4._8_4_ = fStack_208;
  auVar4._12_4_ = fStack_204;
  fVar42 = auVar30._0_4_;
  fVar65 = auVar30._4_4_;
  fVar16 = auVar30._8_4_;
  fVar61 = auVar30._12_4_;
  auVar30 = vsubps_avx(auVar4,auVar22);
  fVar43 = auVar30._0_4_;
  fVar66 = auVar30._4_4_;
  fVar57 = auVar30._8_4_;
  fVar62 = auVar30._12_4_;
  auVar44._0_4_ = fVar35 * fVar43 + fVar29 * fVar42 + fVar21 * fVar41;
  auVar44._4_4_ = fVar35 * fVar66 + fVar29 * fVar65 + fVar21 * fVar64;
  auVar44._8_4_ = fVar35 * fVar57 + fVar29 * fVar16 + fVar21 * fVar67;
  auVar44._12_4_ = fVar35 * fVar62 + fVar29 * fVar61 + fVar21 * fVar60;
  auVar38._0_4_ = fVar36 * fVar43 + fVar26 * fVar42 + fVar27 * fVar41;
  auVar38._4_4_ = fVar36 * fVar66 + fVar26 * fVar65 + fVar27 * fVar64;
  auVar38._8_4_ = fVar36 * fVar57 + fVar26 * fVar16 + fVar27 * fVar67;
  auVar38._12_4_ = fVar36 * fVar62 + fVar26 * fVar61 + fVar27 * fVar60;
  auVar23._0_4_ = fVar37 * fVar43 + fVar34 * fVar42 + fVar28 * fVar41;
  auVar23._4_4_ = fVar37 * fVar66 + fVar34 * fVar65 + fVar28 * fVar64;
  auVar23._8_4_ = fVar37 * fVar57 + fVar34 * fVar16 + fVar28 * fVar67;
  auVar23._12_4_ = fVar37 * fVar62 + fVar34 * fVar61 + fVar28 * fVar60;
  auVar30 = vsubps_avx(auVar44,auVar54);
  auVar3 = vsubps_avx(auVar38,auVar63);
  fVar28 = auVar3._0_4_;
  auVar45._0_4_ = fVar28 * -auVar63._0_4_;
  fVar41 = auVar3._4_4_;
  auVar45._4_4_ = fVar41 * -auVar63._4_4_;
  fVar42 = auVar3._8_4_;
  auVar45._8_4_ = fVar42 * -auVar63._8_4_;
  fVar43 = auVar3._12_4_;
  auVar45._12_4_ = fVar43 * -auVar63._12_4_;
  fVar29 = auVar30._0_4_;
  auVar47._0_4_ = auVar54._0_4_ * fVar29;
  fVar21 = auVar30._4_4_;
  auVar47._4_4_ = auVar54._4_4_ * fVar21;
  fVar26 = auVar30._8_4_;
  auVar47._8_4_ = auVar54._8_4_ * fVar26;
  fVar27 = auVar30._12_4_;
  auVar47._12_4_ = auVar54._12_4_ * fVar27;
  auVar3 = vsubps_avx(auVar45,auVar47);
  auVar48._0_4_ = fVar29 * fVar29 + fVar28 * fVar28;
  auVar48._4_4_ = fVar21 * fVar21 + fVar41 * fVar41;
  auVar48._8_4_ = fVar26 * fVar26 + fVar42 * fVar42;
  auVar48._12_4_ = fVar27 * fVar27 + fVar43 * fVar43;
  auVar30 = vrcpps_avx(auVar48);
  fVar34 = auVar30._0_4_;
  auVar49._0_4_ = fVar34 * auVar48._0_4_;
  fVar35 = auVar30._4_4_;
  auVar49._4_4_ = fVar35 * auVar48._4_4_;
  fVar36 = auVar30._8_4_;
  auVar49._8_4_ = fVar36 * auVar48._8_4_;
  fVar37 = auVar30._12_4_;
  auVar49._12_4_ = fVar37 * auVar48._12_4_;
  auVar51._8_4_ = 0x3f800000;
  auVar51._0_8_ = 0x3f8000003f800000;
  auVar51._12_4_ = 0x3f800000;
  auVar30 = vsubps_avx(auVar51,auVar49);
  auVar46._0_4_ = auVar3._0_4_ * (fVar34 + fVar34 * auVar30._0_4_);
  auVar46._4_4_ = auVar3._4_4_ * (fVar35 + fVar35 * auVar30._4_4_);
  auVar46._8_4_ = auVar3._8_4_ * (fVar36 + fVar36 * auVar30._8_4_);
  auVar46._12_4_ = auVar3._12_4_ * (fVar37 + fVar37 * auVar30._12_4_);
  auVar30 = vminps_avx(auVar46,auVar51);
  auVar38 = ZEXT416(0) << 0x20;
  local_1e0 = vmaxps_avx(auVar30,auVar38);
  fVar64 = local_1e0._0_4_;
  fVar65 = local_1e0._4_4_;
  fVar66 = local_1e0._8_4_;
  fVar67 = local_1e0._12_4_;
  fVar29 = auVar54._0_4_ + fVar64 * fVar29;
  fVar34 = auVar54._4_4_ + fVar65 * fVar21;
  fVar35 = auVar54._8_4_ + fVar66 * fVar26;
  fVar36 = auVar54._12_4_ + fVar67 * fVar27;
  fVar37 = auVar63._0_4_ + fVar64 * fVar28;
  fVar41 = auVar63._4_4_ + fVar65 * fVar41;
  fVar42 = auVar63._8_4_ + fVar66 * fVar42;
  fVar43 = auVar63._12_4_ + fVar67 * fVar43;
  auVar30 = vsubps_avx(auVar23,auVar58);
  auVar3._4_4_ = fStack_1fc;
  auVar3._0_4_ = local_200;
  auVar3._8_4_ = fStack_1f8;
  auVar3._12_4_ = fStack_1f4;
  auVar3 = vsubps_avx(auVar3,_local_2a0);
  local_1c0._0_4_ = auVar58._0_4_ + fVar64 * auVar30._0_4_;
  local_1c0._4_4_ = auVar58._4_4_ + fVar65 * auVar30._4_4_;
  local_1c0._8_4_ = auVar58._8_4_ + fVar66 * auVar30._8_4_;
  local_1c0._12_4_ = auVar58._12_4_ + fVar67 * auVar30._12_4_;
  fVar21 = (float)local_2a0._0_4_ + fVar64 * auVar3._0_4_;
  fVar26 = (float)local_2a0._4_4_ + fVar65 * auVar3._4_4_;
  fVar27 = fStack_298 + fVar66 * auVar3._8_4_;
  fVar28 = fStack_294 + fVar67 * auVar3._12_4_;
  auVar31._0_4_ = fVar29 * fVar29 + fVar37 * fVar37;
  auVar31._4_4_ = fVar34 * fVar34 + fVar41 * fVar41;
  auVar31._8_4_ = fVar35 * fVar35 + fVar42 * fVar42;
  auVar31._12_4_ = fVar36 * fVar36 + fVar43 * fVar43;
  auVar39._0_4_ = fVar21 * fVar21;
  auVar39._4_4_ = fVar26 * fVar26;
  auVar39._8_4_ = fVar27 * fVar27;
  auVar39._12_4_ = fVar28 * fVar28;
  auVar3 = vcmpps_avx(auVar31,auVar39,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar32._4_4_ = uVar1;
  auVar32._0_4_ = uVar1;
  auVar32._8_4_ = uVar1;
  auVar32._12_4_ = uVar1;
  auVar30 = vcmpps_avx(auVar32,local_1c0,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar55._4_4_ = uVar1;
  auVar55._0_4_ = uVar1;
  auVar55._8_4_ = uVar1;
  auVar55._12_4_ = uVar1;
  auVar56 = ZEXT1664(auVar55);
  auVar22 = vcmpps_avx(local_1c0,auVar55,2);
  auVar30 = vandps_avx(auVar30,auVar22);
  auVar30 = vandnps_avx(_local_290,auVar30);
  fVar29 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
  auVar24._0_4_ = fVar29 * (fVar21 + fVar21);
  auVar24._4_4_ = fVar29 * (fVar26 + fVar26);
  auVar24._8_4_ = fVar29 * (fVar27 + fVar27);
  auVar24._12_4_ = fVar29 * (fVar28 + fVar28);
  auVar22 = vcmpps_avx(local_1c0,auVar24,6);
  auVar30 = vandps_avx(auVar30,auVar22);
  auVar22 = auVar3 & auVar30;
  if ((((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar22 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar22[0xf] < '\0') {
    auVar30 = vandps_avx(auVar30,auVar3);
    local_1b0 = vsubps_avx(auVar4,local_280);
    local_1a0 = vsubps_avx(_local_2f0,local_220);
    local_190 = vsubps_avx(_local_300,local_230);
    auVar3 = vcmpps_avx(auVar38,local_1b0,4);
    auVar22 = vcmpps_avx(auVar38,local_1a0,4);
    auVar22 = vorps_avx(auVar3,auVar22);
    auVar3 = vcmpps_avx(auVar38,local_190,4);
    auVar3 = vorps_avx(auVar22,auVar3);
    auVar30 = vandps_avx(auVar30,auVar3);
    iVar17 = vmovmskps_avx(auVar30);
    if (iVar17 != 0) {
      auVar52 = ZEXT864(0) << 0x20;
      local_1d0 = ZEXT816(0) << 0x20;
      uVar19 = (ulong)(byte)iVar17;
      uVar18 = 1 << ((byte)k & 0x1f);
      auVar40 = vcmpps_avx(ZEXT1632(local_1c0),ZEXT1632(local_1c0),0xf);
      auVar53 = ZEXT3264(auVar40);
      auVar59 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      local_270 = line;
      local_268 = context;
      do {
        local_260.hit = local_180;
        local_260.valid = (int *)local_2c0;
        uVar15 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar5 = *(uint *)(local_1f0 + uVar15 * 4);
        pGVar10 = (pSVar9->geometries).items[uVar5].ptr;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_120 = *(undefined4 *)(local_1e0 + uVar15 * 4);
          local_100 = *(undefined4 *)(local_1d0 + uVar15 * 4);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1c0 + uVar15 * 4);
          local_260.context = context->user;
          local_e0 = (local_270->primIDs).field_0.i[uVar15];
          uVar1 = *(undefined4 *)(local_1b0 + uVar15 * 4);
          uVar2 = *(undefined4 *)(local_1a0 + uVar15 * 4);
          local_160._4_4_ = uVar2;
          local_160._0_4_ = uVar2;
          local_160._8_4_ = uVar2;
          local_160._12_4_ = uVar2;
          local_160._16_4_ = uVar2;
          local_160._20_4_ = uVar2;
          local_160._24_4_ = uVar2;
          local_160._28_4_ = uVar2;
          local_b0 = vpshufd_avx(ZEXT416(uVar5),0);
          uVar2 = *(undefined4 *)(local_190 + uVar15 * 4);
          local_140._4_4_ = uVar2;
          local_140._0_4_ = uVar2;
          local_140._8_4_ = uVar2;
          local_140._12_4_ = uVar2;
          local_140._16_4_ = uVar2;
          local_140._20_4_ = uVar2;
          local_140._24_4_ = uVar2;
          local_140._28_4_ = uVar2;
          local_180[0] = (RTCHitN)(char)uVar1;
          local_180[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar1;
          local_180[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar1;
          local_180[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar1;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar1;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar1;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar1;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar1;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          uStack_9c = (local_260.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_260.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_2c0 = *(undefined1 (*) [16])(mm_lookupmask_ps + ((uVar18 & 0xf) << 4));
          local_2b0 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar18 >> 4) * 0x10);
          local_260.geometryUserPtr = pGVar10->userPtr;
          local_260.N = 8;
          local_260.ray = (RTCRayN *)ray;
          if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar40 = ZEXT1632(auVar53._0_16_);
            (*pGVar10->occlusionFilterN)(&local_260);
            auVar59 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar40 = vcmpps_avx(auVar40,auVar40,0xf);
            auVar53 = ZEXT3264(auVar40);
            auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar56 = ZEXT1664(auVar56._0_16_);
          }
          auVar30 = vpcmpeqd_avx(local_2c0,auVar52._0_16_);
          auVar3 = vpcmpeqd_avx(local_2b0,auVar52._0_16_);
          auVar40._16_16_ = auVar3;
          auVar40._0_16_ = auVar30;
          auVar40 = auVar53._0_32_ & ~auVar40;
          if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar40 >> 0x7f,0) == '\0') &&
                (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar40 >> 0xbf,0) == '\0') &&
              (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar40[0x1f]) {
            auVar25._0_4_ = auVar53._0_4_ ^ auVar30._0_4_;
            auVar25._4_4_ = auVar53._4_4_ ^ auVar30._4_4_;
            auVar25._8_4_ = auVar53._8_4_ ^ auVar30._8_4_;
            auVar25._12_4_ = auVar53._12_4_ ^ auVar30._12_4_;
            auVar25._16_4_ = auVar53._16_4_ ^ auVar3._0_4_;
            auVar25._20_4_ = auVar53._20_4_ ^ auVar3._4_4_;
            auVar25._24_4_ = auVar53._24_4_ ^ auVar3._8_4_;
            auVar25._28_4_ = auVar53._28_4_ ^ auVar3._12_4_;
          }
          else {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
              auVar40 = ZEXT1632(auVar53._0_16_);
              (*p_Var14)(&local_260);
              auVar59 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar40 = vcmpps_avx(auVar40,auVar40,0xf);
              auVar53 = ZEXT3264(auVar40);
              auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar56 = ZEXT1664(auVar56._0_16_);
            }
            auVar30 = vpcmpeqd_avx(local_2c0,auVar52._0_16_);
            auVar3 = vpcmpeqd_avx(local_2b0,auVar52._0_16_);
            auVar33._16_16_ = auVar3;
            auVar33._0_16_ = auVar30;
            auVar25._0_4_ = auVar53._0_4_ ^ auVar30._0_4_;
            auVar25._4_4_ = auVar53._4_4_ ^ auVar30._4_4_;
            auVar25._8_4_ = auVar53._8_4_ ^ auVar30._8_4_;
            auVar25._12_4_ = auVar53._12_4_ ^ auVar30._12_4_;
            auVar25._16_4_ = auVar53._16_4_ ^ auVar3._0_4_;
            auVar25._20_4_ = auVar53._20_4_ ^ auVar3._4_4_;
            auVar25._24_4_ = auVar53._24_4_ ^ auVar3._8_4_;
            auVar25._28_4_ = auVar53._28_4_ ^ auVar3._12_4_;
            auVar40 = vblendvps_avx(auVar59._0_32_,*(undefined1 (*) [32])(local_260.ray + 0x100),
                                    auVar33);
            *(undefined1 (*) [32])(local_260.ray + 0x100) = auVar40;
          }
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0x7f,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0xbf,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar25[0x1f] < '\0') {
            return true;
          }
          *(int *)(ray + k * 4 + 0x100) = auVar56._0_4_;
        }
        uVar19 = uVar19 ^ 1L << (uVar15 & 0x3f);
      } while (uVar19 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }